

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::MaybeLogToEmail(LogSeverity severity,char *message,size_t len)

{
  char *__rhs;
  string body;
  string to;
  string subject;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  long local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((email_logging_severity_ <= severity) || (fLI::FLAGS_logemaillevel <= (int)severity)) {
    std::__cxx11::string::string
              ((string *)&local_98,(string *)fLS::FLAGS_alsologtoemail_buf_abi_cxx11_);
    if (addresses__abi_cxx11_._8_8_ != 0) {
      if (local_90 != 0) {
        std::__cxx11::string::append((char *)&local_98);
      }
      std::__cxx11::string::append((string *)&local_98);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"[LOG] ",&local_b9);
    std::operator+(&local_58,&local_78,*(char **)(LogSeverityNames + (ulong)severity * 8));
    std::operator+(&local_b8,&local_58,": ");
    __rhs = glog_internal_namespace_::ProgramInvocationShortName();
    std::operator+(&local_38,&local_b8,__rhs);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    hostname_abi_cxx11_();
    std::__cxx11::string::string((string *)&local_b8,(string *)hostname__abi_cxx11_);
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::append((char *)&local_b8,(ulong)message);
    SendEmailInternal(local_98,local_38._M_dataplus._M_p,local_b8._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToEmail(LogSeverity severity,
                                            const char* message, size_t len) {
  if (severity >= email_logging_severity_ || severity >= FLAGS_logemaillevel) {
    string to(FLAGS_alsologtoemail);
    if (!addresses_.empty()) {
      if (!to.empty()) {
        to += ",";
      }
      to += addresses_;
    }
    const string subject(
        string("[LOG] ") + LogSeverityNames[severity] + ": " +
        glog_internal_namespace_::ProgramInvocationShortName());
    string body(hostname());
    body += "\n\n";
    body.append(message, len);

    // should NOT use SendEmail().  The caller of this function holds the
    // log_mutex and SendEmail() calls LOG/VLOG which will block trying to
    // acquire the log_mutex object.  Use SendEmailInternal() and set
    // use_logging to false.
    SendEmailInternal(to.c_str(), subject.c_str(), body.c_str(), false);
  }
}